

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageOneofFieldLiteGenerator::
ImmutableMessageOneofFieldLiteGenerator
          (ImmutableMessageOneofFieldLiteGenerator *this,FieldDescriptor *descriptor,
          int messageBitIndex,Context *context)

{
  undefined4 in_EDX;
  FieldDescriptor *in_RSI;
  FieldDescriptor *in_RDI;
  ImmutableMessageFieldLiteGenerator *unaff_retaddr;
  OneofDescriptor *in_stack_00000018;
  Context *in_stack_00000020;
  OneofGeneratorInfo *info;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000370;
  OneofGeneratorInfo *in_stack_00000378;
  FieldDescriptor *in_stack_00000380;
  undefined4 in_stack_ffffffffffffffe8;
  
  ImmutableMessageFieldLiteGenerator::ImmutableMessageFieldLiteGenerator
            (unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),
             (Context *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  *(undefined ***)in_RDI = &PTR__ImmutableMessageOneofFieldLiteGenerator_00897408;
  FieldDescriptor::containing_oneof(in_RSI);
  Context::GetOneofGeneratorInfo(in_stack_00000020,in_stack_00000018);
  SetCommonOneofVariables(in_stack_00000380,in_stack_00000378,in_stack_00000370);
  return;
}

Assistant:

ImmutableMessageOneofFieldLiteGenerator::
    ImmutableMessageOneofFieldLiteGenerator(const FieldDescriptor* descriptor,
                                            int messageBitIndex,
                                            Context* context)
    : ImmutableMessageFieldLiteGenerator(descriptor, messageBitIndex, context) {
  const OneofGeneratorInfo* info =
      context->GetOneofGeneratorInfo(descriptor->containing_oneof());
  SetCommonOneofVariables(descriptor, info, &variables_);
}